

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

Vec3 __thiscall
vkt::sr::anon_unknown_0::MatrixCaseUtils::reduceToVec3(MatrixCaseUtils *this,Mat4x3 *value)

{
  Vector<float,_3> VVar1;
  Vec3 VVar2;
  Vector<float,_3> VStack_38;
  tcu local_2c [12];
  float fVar3;
  
  tcu::operator+((tcu *)&VStack_38,(Vector<float,_3> *)value,(value->m_data).m_data + 1);
  tcu::operator+(local_2c,&VStack_38,(value->m_data).m_data + 2);
  VVar1 = tcu::operator+((tcu *)this,(Vector<float,_3> *)local_2c,(value->m_data).m_data + 3);
  VVar2.m_data[0] = VVar1.m_data[0];
  VVar2.m_data[1] = VVar1.m_data[1];
  register0x00001240 = VVar1.m_data[2];
  return (Vec3)VVar2.m_data;
}

Assistant:

inline tcu::Vec3 reduceToVec3 (const tcu::Mat4x3& value)	{ return value.getColumn(0) + value.getColumn(1) + value.getColumn(2) + value.getColumn(3); }